

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bacPtrAbc.c
# Opt level: O0

int Bac_BoxCountOutputs(Bac_Ntk_t *pNtk,char *pBoxNtk)

{
  int i;
  Bac_Ntk_t *p;
  int ModuleId;
  char *pBoxNtk_local;
  Bac_Ntk_t *pNtk_local;
  
  i = Bac_ManNtkFindId(pNtk->pDesign,pBoxNtk);
  if (i == 0) {
    pNtk_local._4_4_ = 1;
  }
  else {
    p = Bac_ManNtk(pNtk->pDesign,i);
    pNtk_local._4_4_ = Bac_NtkPoNumAlloc(p);
  }
  return pNtk_local._4_4_;
}

Assistant:

int Bac_BoxCountOutputs( Bac_Ntk_t * pNtk, char * pBoxNtk )
{
    int ModuleId = Bac_ManNtkFindId( pNtk->pDesign, pBoxNtk );
    if ( ModuleId == 0 )
        return 1;
    return Bac_NtkPoNumAlloc( Bac_ManNtk(pNtk->pDesign, ModuleId) );
}